

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::onMessage(Application *this)

{
  char cVar1;
  int iVar2;
  IncorrectTagValue *this_00;
  uint num;
  FieldMap *in_RSI;
  allocator<char> aStack_259;
  FieldBase FStack_258;
  FieldBase FStack_200;
  FieldBase FStack_1a8;
  FieldBase FStack_150;
  FieldBase FStack_f8;
  Group GStack_a0;
  
  FIX::MDReqID::MDReqID((MDReqID *)&FStack_f8);
  FIX::SubscriptionRequestType::SubscriptionRequestType((SubscriptionRequestType *)&FStack_258);
  FIX::MarketDepth::MarketDepth((MarketDepth *)&FStack_150);
  FIX::NoRelatedSym::NoRelatedSym((NoRelatedSym *)&FStack_1a8);
  FIX42::MarketDataRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)&GStack_a0);
  FIX::FieldMap::getField(in_RSI,&FStack_f8);
  FIX::FieldMap::getField(in_RSI,&FStack_258);
  cVar1 = FIX::CharField::getValue((CharField *)&FStack_258);
  if (cVar1 == '0') {
    FIX::FieldMap::getField(in_RSI,&FStack_150);
    FIX::FieldMap::getField(in_RSI,&FStack_1a8);
    num = 1;
    while( true ) {
      iVar2 = FIX::IntField::getValue((IntField *)&FStack_1a8);
      if (iVar2 < (int)num) break;
      FIX::Symbol::Symbol((Symbol *)&FStack_200);
      FIX::Message::getGroup((Message *)in_RSI,num,&GStack_a0);
      FIX::FieldMap::getField(&GStack_a0.super_FieldMap,&FStack_200);
      FIX::FieldBase::~FieldBase(&FStack_200);
      num = num + 1;
    }
    FIX::FieldMap::~FieldMap(&GStack_a0.super_FieldMap);
    FIX::FieldBase::~FieldBase(&FStack_1a8);
    FIX::FieldBase::~FieldBase(&FStack_150);
    FIX::FieldBase::~FieldBase(&FStack_258);
    FIX::FieldBase::~FieldBase(&FStack_f8);
    return;
  }
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&FStack_200,"",&aStack_259);
  FIX::IncorrectTagValue::IncorrectTagValue(this_00,FStack_258.m_tag,(string *)&FStack_200);
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void Application::onMessage(const FIX42::MarketDataRequest &message, const FIX::SessionID &) {
  FIX::MDReqID mdReqID;
  FIX::SubscriptionRequestType subscriptionRequestType;
  FIX::MarketDepth marketDepth;
  FIX::NoRelatedSym noRelatedSym;
  FIX42::MarketDataRequest::NoRelatedSym noRelatedSymGroup;

  message.get(mdReqID);
  message.get(subscriptionRequestType);
  if (subscriptionRequestType != FIX::SubscriptionRequestType_SNAPSHOT) {
    throw FIX::IncorrectTagValue(subscriptionRequestType.getTag());
  }
  message.get(marketDepth);
  message.get(noRelatedSym);

  for (int i = 1; i <= noRelatedSym; ++i) {
    FIX::Symbol symbol;
    message.getGroup(i, noRelatedSymGroup);
    noRelatedSymGroup.get(symbol);
  }
}